

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::DeformableConv2D_x86_avx::create_pipeline(DeformableConv2D_x86_avx *this,Option *opt)

{
  Mat *pMVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  size_t sVar4;
  void *pvVar5;
  Allocator *pAVar6;
  long *plVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int _h;
  undefined4 *puVar13;
  int *piVar14;
  Layer *pLVar15;
  int _w;
  long lVar16;
  undefined4 *puVar17;
  ulong uVar18;
  long lVar19;
  _func_int *p_Var20;
  int iVar21;
  undefined4 *puVar22;
  undefined4 *puVar23;
  ParamDict permute_pd;
  ParamDict pd;
  ParamDict PStack_148;
  ParamDict local_138;
  Mat local_128;
  undefined8 local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined8 local_c0;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined8 local_a0;
  Mat local_98;
  Mat *local_48;
  Option *local_40;
  void *local_38;
  
  pMVar1 = (Mat *)(&this->field_0x150 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]);
  iVar21 = (int)pMVar1[-2].elemsize;
  _w = pMVar1[-2].elempack * *(int *)((long)&pMVar1[-2].elemsize + 4);
  uVar8 = (long)(int)pMVar1[-2].cstep / (long)(_w * iVar21);
  _h = (int)uVar8;
  Mat::reshape(&local_98,pMVar1,_w,_h,iVar21,(Allocator *)0x0);
  pMVar1 = &this->weight_data_t;
  p_Var20 = this->_vptr_DeformableConv2D_x86_avx[-3];
  Mat::create(pMVar1,_h,
              *(int *)(&this->field_0xd8 + (long)p_Var20) *
              *(int *)(&this->field_0xd4 + (long)p_Var20),
              *(int *)(&this->field_0xd0 + (long)p_Var20),4,(Allocator *)0x0);
  local_38 = pMVar1->data;
  iVar21 = -100;
  if ((local_38 != (void *)0x0) &&
     (sVar2 = (this->weight_data_t).cstep, (long)(this->weight_data_t).c * sVar2 != 0)) {
    pp_Var3 = this->_vptr_DeformableConv2D_x86_avx;
    p_Var20 = pp_Var3[-3];
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var20)) {
      sVar4 = (this->weight_data_t).elemsize;
      lVar19 = 0;
      puVar13 = (undefined4 *)local_98.data;
      do {
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var20) *
                *(int *)(&this->field_0xd4 + (long)p_Var20)) {
          puVar22 = (undefined4 *)(sVar2 * sVar4 * lVar19 + (long)local_38);
          lVar16 = 0;
          puVar17 = puVar13;
          do {
            uVar18 = uVar8 & 0xffffffff;
            puVar23 = puVar17;
            if (0 < _h) {
              do {
                *puVar22 = *puVar23;
                puVar22 = puVar22 + 1;
                puVar23 = (undefined4 *)
                          ((long)puVar23 +
                          (long)local_98.w *
                          CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize));
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
              p_Var20 = pp_Var3[-3];
            }
            lVar16 = lVar16 + 1;
            puVar17 = puVar17 + 1;
          } while (lVar16 < (long)*(int *)(&this->field_0xd8 + (long)p_Var20) *
                            (long)*(int *)(&this->field_0xd4 + (long)p_Var20));
        }
        lVar19 = lVar19 + 1;
        puVar13 = (undefined4 *)
                  ((long)puVar13 +
                  CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * local_98.cstep);
      } while (lVar19 < *(int *)(&this->field_0xd0 + (long)p_Var20));
    }
    piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    local_48 = pMVar1;
    local_40 = opt;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_98.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
            free(local_98.data);
          }
        }
        else {
          (*(local_98.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_98.cstep = 0;
    local_98.data = (undefined4 *)0x0;
    local_98.refcount._0_4_ = 0;
    local_98.refcount._4_4_ = 0;
    local_98.elemsize._0_4_ = 0;
    local_98.elemsize._4_4_ = 0;
    local_98.elempack = 0;
    local_98.dims = 0;
    local_98.w = 0;
    local_98.h = 0;
    local_98.d = 0;
    local_98.c = 0;
    p_Var20 = this->_vptr_DeformableConv2D_x86_avx[-3];
    Mat::reshape(&local_128,pMVar1,
                 _h * *(int *)(&this->field_0xd4 + (long)p_Var20) *
                 *(int *)(&this->field_0xd8 + (long)p_Var20),
                 *(int *)(&this->field_0xd0 + (long)p_Var20),(Allocator *)0x0);
    piVar14 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (pMVar1 != &local_128) {
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (this->weight_data_t).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar5 = (this->weight_data_t).data;
          pAVar6 = (this->weight_data_t).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      piVar14 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).data = local_128.data;
      (this->weight_data_t).refcount =
           (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      (this->weight_data_t).elemsize =
           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      (this->weight_data_t).elempack = local_128.elempack;
      (this->weight_data_t).allocator = local_128.allocator;
      (this->weight_data_t).dims = local_128.dims;
      (this->weight_data_t).w = local_128.w;
      (this->weight_data_t).h = local_128.h;
      (this->weight_data_t).d = local_128.d;
      (this->weight_data_t).c = local_128.c;
      (this->weight_data_t).cstep = local_128.cstep;
    }
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pLVar15 = create_layer(0xf);
    this->inner_product = pLVar15;
    ParamDict::ParamDict(&local_138);
    ParamDict::set(&local_138,0,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    ParamDict::set(&local_138,1,
                   *(int *)(&this->field_0xfc + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    ParamDict::set(&local_138,2,
                   *(int *)(&this->field_0x100 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    ParamDict::set(&local_138,9,
                   *(int *)(&this->field_0x104 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    ParamDict::set(&local_138,10,
                   (Mat *)(&this->field_0x108 + (long)this->_vptr_DeformableConv2D_x86_avx[-3]));
    (*this->inner_product->_vptr_Layer[2])(this->inner_product,&local_138);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    if (&local_128 != pMVar1) {
      piVar14 = (this->weight_data_t).refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_128.data = (this->weight_data_t).data;
      piVar14 = (this->weight_data_t).refcount;
      local_128.refcount._0_4_ = SUB84(piVar14,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)piVar14 >> 0x20);
      sVar2 = (this->weight_data_t).elemsize;
      local_128.elemsize._0_4_ = (undefined4)sVar2;
      local_128.elemsize._4_4_ = (undefined4)(sVar2 >> 0x20);
      local_128.elempack = (this->weight_data_t).elempack;
      local_128.allocator = (this->weight_data_t).allocator;
      uVar9 = (this->weight_data_t).dims;
      uVar10 = (this->weight_data_t).w;
      uVar11 = (this->weight_data_t).h;
      uVar12 = (this->weight_data_t).d;
      local_128.c = (this->weight_data_t).c;
      local_128.cstep = (this->weight_data_t).cstep;
      local_128.dims = uVar9;
      local_128.w = uVar10;
      local_128.h = uVar11;
      local_128.d = uVar12;
    }
    local_a0 = 0;
    local_a8 = 0;
    uStack_ac = 0;
    uStack_b0 = 0;
    uStack_b4 = 0;
    uStack_b8 = 0;
    local_c0 = 0;
    local_c8 = 0;
    uStack_cc = 0;
    local_d0 = 0;
    uStack_d4 = 0;
    uStack_d8 = 0;
    local_e0 = 0;
    p_Var20 = this->_vptr_DeformableConv2D_x86_avx[-3];
    if ((*(int *)(&this->field_0xfc + (long)p_Var20) != 0) &&
       (&local_e0 != (undefined8 *)(&this->field_0x198 + (long)p_Var20))) {
      piVar14 = *(int **)(&this->field_0x1a0 + (long)p_Var20);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      local_e0 = *(undefined8 *)(&this->field_0x198 + (long)p_Var20);
      uStack_d8 = (undefined4)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var20);
      uStack_d4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a0 + (long)p_Var20) >> 0x20);
      local_d0 = (undefined4)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var20);
      uStack_cc = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1a8 + (long)p_Var20) >> 0x20);
      local_c8 = *(undefined4 *)(&this->field_0x1b0 + (long)p_Var20);
      local_c0 = *(undefined8 *)(&this->field_0x1b8 + (long)p_Var20);
      uStack_b8 = (undefined4)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var20);
      uStack_b4 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c0 + (long)p_Var20) >> 0x20);
      uStack_b0 = (undefined4)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var20);
      uStack_ac = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1c8 + (long)p_Var20) >> 0x20);
      local_a8 = *(undefined4 *)(&this->field_0x1d0 + (long)p_Var20);
      local_a0 = *(undefined8 *)(&this->field_0x1d8 + (long)p_Var20);
    }
    pLVar15 = this->inner_product;
    ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_148,&local_128);
    (*pLVar15->_vptr_Layer[3])(pLVar15,&PStack_148);
    ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_148);
    (*this->inner_product->_vptr_Layer[4])();
    pLVar15 = create_layer(0x2f);
    this->permute = pLVar15;
    ParamDict::ParamDict(&PStack_148);
    ParamDict::set(&PStack_148,0,1);
    (*this->permute->_vptr_Layer[2])(this->permute,&PStack_148);
    (*this->permute->_vptr_Layer[4])(this->permute,opt);
    ParamDict::~ParamDict(&PStack_148);
    lVar19 = 0x48;
    do {
      piVar14 = *(int **)((long)&local_128.refcount + lVar19);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          pvVar5 = *(void **)((long)&local_128.data + lVar19);
          plVar7 = *(long **)((long)&local_128.allocator + lVar19);
          if (plVar7 == (long *)0x0) {
            if (pvVar5 != (void *)0x0) {
              free(pvVar5);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_128.cstep + lVar19) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar19 + 4) = 0;
      *(undefined8 *)((long)&local_128.elemsize + lVar19 + 4) = 0;
      *(undefined8 *)((long)&local_128.data + lVar19) = 0;
      *(undefined8 *)((long)&local_128.refcount + lVar19) = 0;
      *(undefined8 *)((long)&local_128.dims + lVar19) = 0;
      *(undefined8 *)((long)&local_128.h + lVar19) = 0;
      *(undefined4 *)((long)&local_128.c + lVar19) = 0;
      lVar19 = lVar19 + -0x48;
    } while (lVar19 != -0x48);
    ParamDict::~ParamDict(&local_138);
    iVar21 = 0;
  }
  piVar14 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if ((undefined4 *)local_98.data != (undefined4 *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int DeformableConv2D_x86_avx::create_pipeline(const Option& opt)
{
    const int in_c = weight_data_size / (num_output * kernel_h * kernel_w);
    {
        Mat weight_3d = weight_data.reshape(kernel_w * kernel_h, in_c, num_output);
        weight_data_t.create(in_c, kernel_w * kernel_h, num_output);
        if (weight_data_t.empty())
            return -100;
        for (int q = 0; q < num_output; q++)
        {
            const Mat m = weight_3d.channel(q);
            float* outptr = weight_data_t.channel(q);

            for (int i = 0; i < kernel_w * kernel_h; i++)
            {
                for (int j = 0; j < in_c; j++)
                {
                    *outptr++ = m.row(j)[i];
                }
            }
        }
        weight_3d.release();
        weight_data_t = weight_data_t.reshape(in_c * kernel_w * kernel_h, num_output);

        inner_product = ncnn::create_layer(ncnn::LayerType::InnerProduct);
        ncnn::ParamDict pd;
        pd.set(0, num_output);
        pd.set(1, bias_term);
        pd.set(2, weight_data_size);
        pd.set(9, activation_type);
        pd.set(10, activation_params);
        inner_product->load_param(pd);
        ncnn::Mat weights[2];
        weights[0] = weight_data_t;
        if (bias_term)
            weights[1] = bias_data;
        inner_product->load_model(ncnn::ModelBinFromMatArray(weights));
        inner_product->create_pipeline(opt);

        permute = ncnn::create_layer(ncnn::LayerType::Permute);
        ncnn::ParamDict permute_pd;
        permute_pd.set(0, 1);
        permute->load_param(permute_pd);
        permute->create_pipeline(opt);
    }

    return 0;
}